

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toggle.cpp
# Opt level: O2

bool __thiscall ftxui::anon_unknown_3::ToggleBase::OnEvent(ToggleBase *this,Event *event)

{
  ConstStringListRef *this_00;
  pointer pBVar1;
  Ref<int> *pRVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  ToggleOption *pTVar6;
  size_t sVar7;
  size_t sVar8;
  Ref<int> *pRVar9;
  int iVar10;
  ToggleOption *pTVar11;
  function<void_()> *this_01;
  long lVar12;
  string *__lhs;
  int iVar13;
  long lVar14;
  undefined1 local_b0 [64];
  Event local_70;
  
  if (event->type_ == Mouse) {
    Event::Event((Event *)local_b0,event);
    ComponentBase::CaptureMouse((ComponentBase *)&local_70,(Event *)this);
    if ((_func_int **)local_70._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_70._0_8_ + 8))();
      lVar12 = 0;
      for (lVar14 = 0;
          pBVar1 = (this->boxes_).super__Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>.
                   _M_impl.super__Vector_impl_data._M_start,
          lVar14 < (int)((ulong)((long)(this->boxes_).
                                       super__Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >>
                        4); lVar14 = lVar14 + 1) {
        bVar3 = Box::Contain((Box *)((long)&pBVar1->x_min + lVar12),local_b0._16_4_,local_b0._20_4_)
        ;
        if (bVar3) {
          ComponentBase::TakeFocus(&this->super_ComponentBase);
          pTVar6 = (this->option_).address_;
          if (pTVar6 == (ToggleOption *)0x0) {
            pTVar6 = &(this->option_).owned_;
          }
          pRVar2 = (Ref<int> *)(pTVar6->focused_entry).address_;
          pRVar9 = &pTVar6->focused_entry;
          if (pRVar2 != (Ref<int> *)0x0) {
            pRVar9 = pRVar2;
          }
          iVar13 = (int)lVar14;
          pRVar9->owned_ = iVar13;
          if ((local_b0._4_4_ == Left) && (local_b0._8_4_ == Pressed)) {
            ComponentBase::TakeFocus(&this->super_ComponentBase);
            bVar3 = true;
            if (*this->selected_ != iVar13) {
              *this->selected_ = iVar13;
              pTVar6 = (this->option_).address_;
              pTVar11 = &(this->option_).owned_;
              if (pTVar6 != (ToggleOption *)0x0) {
                pTVar11 = pTVar6;
              }
              std::function<void_()>::operator()(&pTVar11->on_change);
            }
            goto LAB_0013d01a;
          }
        }
        lVar12 = lVar12 + 0x10;
      }
    }
    bVar3 = false;
LAB_0013d01a:
    std::__cxx11::string::~string((string *)(local_b0 + 0x18));
    return bVar3;
  }
  iVar13 = *this->selected_;
  __lhs = &event->input_;
  _Var4 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(Event::ArrowLeft + 0x18));
  if (_Var4) {
LAB_0013ced2:
    *this->selected_ = *this->selected_ + -1;
  }
  else {
    Event::Character(&local_70,'h');
    _Var4 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&local_70 + 0x18U));
    std::__cxx11::string::~string((string *)((long)&local_70 + 0x18U));
    if (_Var4) goto LAB_0013ced2;
  }
  _Var4 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(Event::ArrowRight + 0x18));
  if (!_Var4) {
    Event::Character(&local_70,'l');
    _Var4 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&local_70 + 0x18U));
    std::__cxx11::string::~string((string *)((long)&local_70 + 0x18U));
    if (!_Var4) goto LAB_0013cf21;
  }
  *this->selected_ = *this->selected_ + 1;
LAB_0013cf21:
  _Var4 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(Event::Tab + 0x18));
  if (_Var4) {
    sVar7 = ConstStringListRef::size(&this->entries_);
    if (sVar7 != 0) {
      iVar10 = *this->selected_;
      sVar7 = ConstStringListRef::size(&this->entries_);
      *this->selected_ = (int)(((long)iVar10 + 1U) % sVar7);
    }
  }
  _Var4 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(Event::TabReverse + 0x18));
  if (_Var4) {
    this_00 = &this->entries_;
    sVar7 = ConstStringListRef::size(this_00);
    if (sVar7 != 0) {
      iVar10 = *this->selected_;
      sVar7 = ConstStringListRef::size(this_00);
      sVar8 = ConstStringListRef::size(this_00);
      *this->selected_ = (int)((((long)iVar10 + sVar7) - 1) % sVar8);
    }
  }
  sVar7 = ConstStringListRef::size(&this->entries_);
  iVar5 = (int)sVar7 + -1;
  iVar10 = *this->selected_;
  if (iVar10 < iVar5) {
    iVar5 = iVar10;
  }
  iVar10 = 0;
  if (0 < iVar5) {
    iVar10 = iVar5;
  }
  *this->selected_ = iVar10;
  if (iVar13 == iVar10) {
    _Var4 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(Event::Return + 0x18));
    if (!_Var4) {
      return false;
    }
    pTVar6 = (this->option_).address_;
    pTVar11 = &(this->option_).owned_;
    if (pTVar6 != (ToggleOption *)0x0) {
      pTVar11 = pTVar6;
    }
    this_01 = &pTVar11->on_enter;
  }
  else {
    pTVar6 = (this->option_).address_;
    pTVar11 = &(this->option_).owned_;
    if (pTVar6 != (ToggleOption *)0x0) {
      pTVar11 = pTVar6;
    }
    pRVar2 = (Ref<int> *)(pTVar11->focused_entry).address_;
    pRVar9 = &pTVar11->focused_entry;
    if (pRVar2 != (Ref<int> *)0x0) {
      pRVar9 = pRVar2;
    }
    pRVar9->owned_ = iVar10;
    this_01 = &pTVar11->on_change;
  }
  std::function<void_()>::operator()(this_01);
  return true;
}

Assistant:

bool OnEvent(Event event) override {
    if (event.is_mouse())
      return OnMouseEvent(event);

    int old_selected = *selected_;
    if (event == Event::ArrowLeft || event == Event::Character('h'))
      (*selected_)--;
    if (event == Event::ArrowRight || event == Event::Character('l'))
      (*selected_)++;
    if (event == Event::Tab && entries_.size())
      *selected_ = (*selected_ + 1) % entries_.size();
    if (event == Event::TabReverse && entries_.size())
      *selected_ = (*selected_ + entries_.size() - 1) % entries_.size();

    *selected_ = std::max(0, std::min(int(entries_.size()) - 1, *selected_));

    if (old_selected != *selected_) {
      focused_entry() = *selected_;
      option_->on_change();
      return true;
    }

    if (event == Event::Return) {
      option_->on_enter();
      return true;
    }

    return false;
  }